

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

int Ivy_ManLatchIsSelfFeed_rec(Ivy_Obj_t *pLatch,Ivy_Obj_t *pLatchRoot)

{
  int iVar1;
  Ivy_Obj_t *pLatch_00;
  Ivy_Obj_t *pLatchRoot_local;
  Ivy_Obj_t *pLatch_local;
  
  iVar1 = Ivy_ObjIsLatch(pLatch);
  if ((iVar1 == 0) && (iVar1 = Ivy_ObjIsBuf(pLatch), iVar1 == 0)) {
    return 0;
  }
  if (pLatch == pLatchRoot) {
    pLatch_local._4_4_ = 1;
  }
  else {
    pLatch_00 = Ivy_ObjFanin0(pLatch);
    pLatch_local._4_4_ = Ivy_ManLatchIsSelfFeed_rec(pLatch_00,pLatchRoot);
  }
  return pLatch_local._4_4_;
}

Assistant:

int Ivy_ManLatchIsSelfFeed_rec( Ivy_Obj_t * pLatch, Ivy_Obj_t * pLatchRoot )
{
    if ( !Ivy_ObjIsLatch(pLatch) && !Ivy_ObjIsBuf(pLatch) )
        return 0;
    if ( pLatch == pLatchRoot )
        return 1;
    return Ivy_ManLatchIsSelfFeed_rec( Ivy_ObjFanin0(pLatch), pLatchRoot );
}